

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEES_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::SEES_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,SEES_PDU *this)

{
  ostream *poVar1;
  ulong uVar2;
  char cVar3;
  pointer pPVar4;
  pointer pVVar5;
  KString local_3a0;
  string local_380 [32];
  KString local_360;
  stringstream local_340 [16];
  ostream local_330 [376];
  KStringStream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  Header7::GetAsString_abi_cxx11_(&local_360,&this->super_Header);
  poVar1 = std::operator<<(local_1a8,(string *)&local_360);
  poVar1 = std::operator<<(poVar1,"-SEES PDU-\n");
  poVar1 = std::operator<<(poVar1,"Originating Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_3a0,&this->m_OriginatingEntity);
  std::__cxx11::stringstream::stringstream(local_340);
  std::operator<<(local_330,'\t');
  uVar2 = 0;
  while( true ) {
    uVar2 = uVar2 & 0xffff;
    if (local_3a0._M_string_length <= uVar2) break;
    cVar3 = local_3a0._M_dataplus._M_p[uVar2];
    if (local_3a0._M_string_length - 1 != uVar2 && cVar3 == '\n') {
      cVar3 = '\t';
      std::operator<<(local_330,'\n');
    }
    std::operator<<(local_330,cVar3);
    uVar2 = (ulong)((int)uVar2 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  poVar1 = std::operator<<(poVar1,local_380);
  poVar1 = std::operator<<(poVar1,"IR Signature Representation Index:                  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16IrSigRepIndex);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Acosutic Signature Representation Index:            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16AcousticSigRepIndex);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Radar Cross Section Signature Representation Index: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16CrossSection);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Number Of Propulsion Systems:                       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16NumPropulsionSys);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Number Of Vectoring Nozzle Systems:                 ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16NumVectoringNozzleSys);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_360);
  for (pPVar4 = (this->m_vPropSys).
                super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar4 != (this->m_vPropSys).
                super__Vector_base<KDIS::DATA_TYPE::PropulsionSystem,_std::allocator<KDIS::DATA_TYPE::PropulsionSystem>_>
                ._M_impl.super__Vector_impl_data._M_finish; pPVar4 = pPVar4 + 1) {
    (*(pPVar4->super_DataTypeBase)._vptr_DataTypeBase[2])((string *)local_340,pPVar4);
    std::operator<<(local_1a8,(string *)local_340);
    std::__cxx11::string::~string((string *)local_340);
  }
  for (pVVar5 = (this->m_vVecNozzleSys).
                super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar5 != (this->m_vVecNozzleSys).
                super__Vector_base<KDIS::DATA_TYPE::VectoringNozzleSystem,_std::allocator<KDIS::DATA_TYPE::VectoringNozzleSystem>_>
                ._M_impl.super__Vector_impl_data._M_finish; pVVar5 = pVVar5 + 1) {
    (*(pVVar5->super_DataTypeBase)._vptr_DataTypeBase[2])((string *)local_340,pVVar5);
    std::operator<<(local_1a8,(string *)local_340);
    std::__cxx11::string::~string((string *)local_340);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString SEES_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-SEES PDU-\n"
       << "Originating Entity ID:\n"
       << IndentString( m_OriginatingEntity.GetAsString(), 1 )
       << "IR Signature Representation Index:                  " << m_ui16IrSigRepIndex         << "\n"
       << "Acosutic Signature Representation Index:            " << m_ui16AcousticSigRepIndex   << "\n"
       << "Radar Cross Section Signature Representation Index: " << m_ui16CrossSection          << "\n"
       << "Number Of Propulsion Systems:                       " << m_ui16NumPropulsionSys      << "\n"
       << "Number Of Vectoring Nozzle Systems:                 " << m_ui16NumVectoringNozzleSys << "\n";

    vector<PropulsionSystem>::const_iterator citrPS = m_vPropSys.begin();

    for( ; citrPS != m_vPropSys.end(); ++citrPS )
    {
        ss << citrPS->GetAsString();
    }

    vector<VectoringNozzleSystem>::const_iterator citrVNS = m_vVecNozzleSys.begin();

    for( ; citrVNS != m_vVecNozzleSys.end(); ++citrVNS )
    {
        ss << citrVNS->GetAsString();
    }

    return ss.str();
}